

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               size_t size_hint,size_t *num_literal_contexts,uint32_t **literal_context_map,
               uint32_t *arena)

{
  byte bVar1;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  undefined1 auVar7 [16];
  size_t stride_end_pos;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  undefined1 *puVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  uint32_t *puVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  double dVar36;
  uint32_t monogram_histo [3];
  uint32_t two_prefix_histo [6];
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  uint local_a8 [4];
  undefined1 local_98 [16];
  size_t local_80;
  uint8_t *local_78;
  int local_6c;
  uint local_68 [6];
  double local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  byte bVar2;
  
  if (length < 0x40 || quality < 5) {
    return;
  }
  local_6c = quality;
  if (0xfffff < size_hint) {
    uVar19 = length + start_pos;
    uVar18 = 0;
    local_78 = input;
    local_38 = length;
    switchD_005700f1::default(arena,0,0x700);
    local_48 = start_pos;
    uVar8 = start_pos + 0x40;
    local_d8 = ZEXT816(0);
    local_50 = 0.0;
    if (uVar8 <= uVar19) {
      do {
        if (start_pos + 2 < uVar8) {
          lVar16 = 2;
          bVar3 = local_78[start_pos + 1 & mask];
          bVar1 = local_78[start_pos & mask];
          do {
            bVar2 = bVar3;
            bVar3 = local_78[start_pos + lVar16 & mask];
            uVar4 = *(uint *)(ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                              ::kStaticContextMapComplexUTF8 +
                             (ulong)(byte)((&DAT_01426760)[bVar1] | (&DAT_01426660)[bVar2]) * 4);
            uVar21 = (uint)(bVar3 >> 3);
            arena[uVar21] = arena[uVar21] + 1;
            arena[(ulong)((uVar4 & 0xff) << 5 | uVar21) + 0x20] =
                 arena[(ulong)((uVar4 & 0xff) << 5 | uVar21) + 0x20] + 1;
            lVar16 = lVar16 + 1;
            bVar1 = bVar2;
          } while (lVar16 != 0x40);
          uVar18 = uVar18 + 0x3e;
        }
        start_pos = start_pos + 0x1000;
        uVar8 = uVar8 + 0x1000;
      } while (uVar8 <= uVar19);
      local_50 = (double)uVar18;
    }
    local_80 = mask;
    uVar8 = 0xfffffffffffffff8;
    uVar19 = 0;
    do {
      uVar12 = (ulong)*(uint *)((long)arena + uVar8 + 8);
      if (uVar12 < 0x100) {
        uVar32 = (undefined4)(&duckdb_brotli::kBrotliLog2Table)[uVar12];
        uVar33 = (undefined4)((ulong)(&duckdb_brotli::kBrotliLog2Table)[uVar12] >> 0x20);
      }
      else {
        dVar24 = log2((double)uVar12);
        uVar32 = SUB84(dVar24,0);
        uVar33 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      uVar14 = (ulong)*(uint *)((long)arena + uVar8 + 0xc);
      if (uVar14 < 0x100) {
        dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar14];
      }
      else {
        dVar24 = log2((double)uVar14);
      }
      uVar34 = local_d8._8_4_;
      uVar35 = local_d8._12_4_;
      uVar19 = uVar19 + uVar12 + uVar14;
      local_d8._0_8_ =
           (local_d8._0_8_ - (double)uVar12 * (double)CONCAT44(uVar33,uVar32)) -
           (double)uVar14 * dVar24;
      local_d8._8_4_ = uVar34;
      local_d8._12_4_ = uVar35;
      uVar8 = uVar8 + 8;
    } while (uVar8 < 0x78);
    if (uVar19 != 0) {
      auVar26._8_4_ = (int)(uVar19 >> 0x20);
      auVar26._0_8_ = uVar19;
      auVar26._12_4_ = 0x45300000;
      dVar24 = (auVar26._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
      if (uVar19 < 0x100) {
        dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
      }
      else {
        dVar23 = log2(dVar24);
      }
      local_d8._0_8_ = (double)local_d8._0_8_ + dVar24 * dVar23;
    }
    puVar17 = arena + 0x21;
    dVar24 = 0.0;
    lVar16 = 0;
    do {
      local_40 = lVar16;
      uVar19 = 0xfffffffffffffff8;
      dVar23 = 0.0;
      uVar8 = 0;
      do {
        uVar12 = (ulong)*(uint *)((long)puVar17 + uVar19 + 4);
        if (uVar12 < 0x100) {
          dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar12];
        }
        else {
          dVar25 = log2((double)uVar12);
        }
        uVar14 = (ulong)*(uint *)((long)puVar17 + uVar19 + 8);
        dVar36 = (double)uVar14;
        if (uVar14 < 0x100) {
          dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar14];
        }
        else {
          local_98._0_8_ = dVar36;
          dVar22 = log2(dVar36);
          dVar36 = (double)local_98._0_8_;
        }
        lVar16 = local_40;
        input = local_78;
        uVar8 = uVar8 + uVar12 + uVar14;
        dVar23 = (dVar23 - (double)uVar12 * dVar25) - dVar36 * dVar22;
        uVar19 = uVar19 + 8;
      } while (uVar19 < 0x78);
      if (uVar8 != 0) {
        auVar27._8_4_ = (int)(uVar8 >> 0x20);
        auVar27._0_8_ = uVar8;
        auVar27._12_4_ = 0x45300000;
        dVar25 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
        if (uVar8 < 0x100) {
          dVar36 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
        }
        else {
          dVar36 = log2(dVar25);
        }
        dVar23 = dVar23 + dVar25 * dVar36;
      }
      dVar24 = dVar24 + dVar23;
      lVar16 = lVar16 + 1;
      puVar17 = puVar17 + 0x20;
    } while (lVar16 != 0xd);
    dVar24 = dVar24 * (1.0 / local_50);
    length = local_38;
    start_pos = local_48;
    mask = local_80;
    if ((dVar24 <= 3.0) && (0.2 <= (1.0 / local_50) * (double)local_d8._0_8_ - dVar24)) {
      *num_literal_contexts = 0xd;
      puVar11 = ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                ::kStaticContextMapComplexUTF8;
      goto LAB_0111cf5e;
    }
  }
  uVar19 = length + start_pos;
  arena[4] = 0;
  arena[5] = 0;
  arena[6] = 0;
  arena[7] = 0;
  arena[0] = 0;
  arena[1] = 0;
  arena[2] = 0;
  arena[3] = 0;
  arena[8] = 0;
  for (uVar8 = start_pos + 0x40; uVar8 <= uVar19; uVar8 = uVar8 + 0x1000) {
    if (start_pos + 1 < uVar8) {
      piVar15 = DecideOverLiteralContextModeling::lut + (input[start_pos & mask] >> 6);
      lVar16 = 1;
      do {
        iVar5 = *piVar15;
        piVar15 = DecideOverLiteralContextModeling::lut + (input[start_pos + lVar16 & mask] >> 6);
        arena[(long)*piVar15 + (long)iVar5 * 3] = arena[(long)*piVar15 + (long)iVar5 * 3] + 1;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x40);
    }
    start_pos = start_pos + 0x1000;
  }
  puVar10 = local_a8 + 1;
  uVar8 = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar8;
    uVar19 = SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2;
    uVar6 = arena[uVar8];
    piVar15 = (int *)((long)local_a8 + uVar8 * 4 + (uVar19 & 0xfffffffffffffffc) * -3);
    *piVar15 = *piVar15 + uVar6;
    piVar15 = (int *)((long)local_68 + uVar8 * 4 + (uVar19 & 0xfffffffffffffff8) * -3);
    *piVar15 = *piVar15 + uVar6;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 9);
  bVar13 = true;
  puVar9 = local_a8;
  dVar24 = 0.0;
  uVar32 = 0;
  uVar33 = 0;
  lVar16 = 0;
  while( true ) {
    uVar8 = (ulong)*puVar9;
    if (uVar8 < 0x100) {
      dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
    }
    else {
      local_98._8_4_ = uVar32;
      local_98._0_8_ = dVar24;
      local_98._12_4_ = uVar33;
      dVar23 = log2((double)uVar8);
      dVar24 = local_98._0_8_;
      uVar32 = local_98._8_4_;
      uVar33 = local_98._12_4_;
    }
    uVar19 = lVar16 + uVar8;
    dVar24 = dVar24 - (double)uVar8 * dVar23;
    if (!bVar13) break;
    uVar8 = (ulong)*puVar10;
    if (uVar8 < 0x100) {
      dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
    }
    else {
      local_98._8_4_ = uVar32;
      local_98._0_8_ = dVar24;
      local_98._12_4_ = uVar33;
      dVar23 = log2((double)uVar8);
      dVar24 = local_98._0_8_;
      uVar32 = local_98._8_4_;
      uVar33 = local_98._12_4_;
    }
    lVar16 = uVar19 + uVar8;
    dVar24 = dVar24 - (double)uVar8 * dVar23;
    bVar13 = false;
    puVar9 = local_a8 + 2;
    puVar10 = local_a8 + 3;
  }
  if (uVar19 != 0) {
    auVar28._8_4_ = (int)(uVar19 >> 0x20);
    auVar28._0_8_ = uVar19;
    auVar28._12_4_ = 0x45300000;
    dVar23 = (auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
    if (uVar19 < 0x100) {
      dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      local_98._8_4_ = uVar32;
      local_98._0_8_ = dVar24;
      local_98._12_4_ = uVar33;
      dVar25 = log2(dVar23);
      dVar24 = local_98._0_8_;
      uVar32 = local_98._8_4_;
      uVar33 = local_98._12_4_;
    }
    dVar24 = dVar24 + dVar23 * dVar25;
  }
  local_98._8_4_ = uVar32;
  local_98._0_8_ = dVar24;
  local_98._12_4_ = uVar33;
  bVar13 = true;
  local_c8 = 0.0;
  lVar16 = 0;
  puVar10 = local_68;
  puVar9 = local_68 + 1;
  while( true ) {
    uVar8 = (ulong)*puVar10;
    if (uVar8 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
    }
    else {
      dVar24 = log2((double)uVar8);
    }
    uVar19 = lVar16 + uVar8;
    local_c8 = local_c8 - (double)uVar8 * dVar24;
    if (!bVar13) break;
    uVar8 = (ulong)*puVar9;
    if (uVar8 < 0x100) {
      dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
    }
    else {
      dVar24 = log2((double)uVar8);
    }
    lVar16 = uVar19 + uVar8;
    local_c8 = local_c8 - (double)uVar8 * dVar24;
    bVar13 = false;
    puVar10 = local_68 + 2;
    puVar9 = local_68 + 3;
  }
  if (uVar19 != 0) {
    auVar29._8_4_ = (int)(uVar19 >> 0x20);
    auVar29._0_8_ = uVar19;
    auVar29._12_4_ = 0x45300000;
    dVar24 = (auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
    if (uVar19 < 0x100) {
      dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar23 = log2(dVar24);
    }
    local_c8 = local_c8 + dVar24 * dVar23;
  }
  uVar8 = 0xc;
  dVar24 = 0.0;
  lVar16 = 0;
  while( true ) {
    uVar19 = (ulong)*(uint *)((long)local_68 + uVar8);
    if (uVar19 < 0x100) {
      dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar23 = log2((double)uVar19);
    }
    uVar12 = lVar16 + uVar19;
    dVar24 = dVar24 - (double)uVar19 * dVar23;
    if (0x13 < uVar8) break;
    uVar19 = (ulong)*(uint *)((long)local_68 + uVar8 + 4);
    if (uVar19 < 0x100) {
      dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
    }
    else {
      dVar23 = log2((double)uVar19);
    }
    lVar16 = uVar12 + uVar19;
    dVar24 = dVar24 - (double)uVar19 * dVar23;
    uVar8 = uVar8 + 8;
  }
  if (uVar12 != 0) {
    auVar30._8_4_ = (int)(uVar12 >> 0x20);
    auVar30._0_8_ = uVar12;
    auVar30._12_4_ = 0x45300000;
    dVar23 = (auVar30._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
    if (uVar12 < 0x100) {
      dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar12];
    }
    else {
      dVar25 = log2(dVar23);
    }
    dVar24 = dVar24 + dVar23 * dVar25;
  }
  local_e0 = 0.0;
  lVar16 = 0;
  do {
    bVar13 = true;
    lVar20 = 0;
    dVar23 = 0.0;
    uVar8 = 0;
    while( true ) {
      uVar19 = (ulong)*(uint *)((long)arena + uVar8 + lVar16 * 0xc);
      if (uVar19 < 0x100) {
        dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar19];
      }
      else {
        dVar25 = log2((double)uVar19);
      }
      uVar12 = lVar20 + uVar19;
      dVar23 = dVar23 - (double)uVar19 * dVar25;
      if (!bVar13) break;
      uVar8 = (ulong)*(uint *)((long)arena + (uVar8 | 4) + lVar16 * 0xc);
      if (uVar8 < 0x100) {
        dVar25 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar8];
      }
      else {
        dVar25 = log2((double)uVar8);
      }
      lVar20 = uVar12 + uVar8;
      dVar23 = dVar23 - (double)uVar8 * dVar25;
      uVar8 = 8;
      bVar13 = false;
    }
    if (uVar12 != 0) {
      auVar31._8_4_ = (int)(uVar12 >> 0x20);
      auVar31._0_8_ = uVar12;
      auVar31._12_4_ = 0x45300000;
      dVar25 = (auVar31._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      if (uVar12 < 0x100) {
        dVar36 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar12];
      }
      else {
        dVar36 = log2(dVar25);
      }
      dVar23 = dVar23 + dVar25 * dVar36;
    }
    local_e0 = local_e0 + dVar23;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  dVar25 = 1.0 / (double)(local_a8[1] + local_a8[0] + local_a8[2]);
  dVar23 = (double)local_98._0_8_ * dVar25;
  dVar24 = (local_c8 + dVar24) * dVar25;
  if (local_6c < 7) {
    local_e0 = dVar23 * 10.0;
  }
  else {
    local_e0 = local_e0 * dVar25;
  }
  if ((dVar23 - dVar24 < 0.2) && (dVar23 - local_e0 < 0.2)) {
    *num_literal_contexts = 1;
    return;
  }
  if (0.02 <= dVar24 - local_e0) {
    *num_literal_contexts = 3;
    puVar11 = ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
              kStaticContextMapContinuation;
  }
  else {
    *num_literal_contexts = 2;
    puVar11 = ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
              kStaticContextMapSimpleUTF8;
  }
LAB_0111cf5e:
  *literal_context_map = (uint32_t *)puVar11;
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality, size_t size_hint,
    size_t* num_literal_contexts, const uint32_t** literal_context_map,
    uint32_t* arena) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else if (ShouldUseComplexStaticContextMap(
      input, start_pos, length, mask, quality, size_hint,
      num_literal_contexts, literal_context_map, arena)) {
    /* Context map was already set, nothing else to do. */
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t* BROTLI_RESTRICT const bigram_prefix_histo = arena;
    memset(bigram_prefix_histo, 0, sizeof(arena[0]) * 9);
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}